

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  ParamDictPrivate *pPVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  undefined8 *puVar4;
  long lVar5;
  void *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  long *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined8 local_38;
  
  lVar5 = 0x48;
  do {
    pPVar1 = this->d;
    puVar4 = (undefined8 *)((long)pPVar1->params + lVar5 + -0x40);
    *(undefined4 *)((long)pPVar1->params + lVar5 + -0x48) = 0;
    local_38 = 0;
    local_78 = (void *)0x0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0;
    uStack_64 = 0;
    local_60 = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    local_58 = (long *)0x0;
    uStack_50 = 0;
    uStack_4c = 0;
    if ((void **)puVar4 != &local_78) {
      piVar2 = *(int **)((long)pPVar1->params + lVar5 + -0x38);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          __ptr = *(void **)((long)pPVar1->params + lVar5 + -0x40);
          plVar3 = *(long **)((long)pPVar1->params + lVar5 + -0x20);
          if (plVar3 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pPVar1->params[0].type + lVar5) = 0;
      *(undefined8 *)((long)pPVar1->params + lVar5 + -0x34) = 0;
      *(undefined8 *)((long)pPVar1->params + lVar5 + -0x2c) = 0;
      *puVar4 = 0;
      *(undefined8 *)((long)pPVar1->params + lVar5 + -0x38) = 0;
      puVar4 = (undefined8 *)((long)pPVar1->params + lVar5 + -0x18);
      *puVar4 = 0;
      puVar4[1] = 0;
      *(undefined4 *)((long)pPVar1->params + lVar5 + -8) = 0;
      puVar4 = (undefined8 *)((long)pPVar1->params + lVar5 + -0x40);
      *puVar4 = local_78;
      puVar4[1] = CONCAT44(uStack_6c,uStack_70);
      *(ulong *)((long)pPVar1->params + lVar5 + -0x30) = CONCAT44(uStack_64,local_68);
      *(undefined4 *)((long)pPVar1->params + lVar5 + -0x28) = local_60;
      *(long **)((long)pPVar1->params + lVar5 + -0x20) = local_58;
      puVar4 = (undefined8 *)((long)pPVar1->params + lVar5 + -0x18);
      *puVar4 = CONCAT44(uStack_4c,uStack_50);
      puVar4[1] = CONCAT44(uStack_44,uStack_48);
      *(undefined4 *)((long)pPVar1->params + lVar5 + -8) = uStack_40;
      *(undefined8 *)((long)&pPVar1->params[0].type + lVar5) = local_38;
    }
    piVar2 = (int *)CONCAT44(uStack_6c,uStack_70);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_58 == (long *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (**(code **)(*local_58 + 0x18))();
        }
      }
    }
    lVar5 = lVar5 + 0x50;
  } while (lVar5 != 0xa48);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].v = Mat();
    }
}